

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O0

int hostkey_method_ssh_dss_sig_verify
              (LIBSSH2_SESSION *session,uchar *sig,size_t sig_len,uchar *m,size_t m_len,
              void **abstract)

{
  DSA *dsactx;
  void **abstract_local;
  size_t m_len_local;
  uchar *m_local;
  size_t sig_len_local;
  uchar *sig_local;
  LIBSSH2_SESSION *session_local;
  
  if (sig_len == 0x37) {
    session_local._4_4_ = _libssh2_dsa_sha1_verify((DSA *)*abstract,sig + 0xf,m,m_len);
  }
  else {
    session_local._4_4_ = _libssh2_error(session,-0xe,"Invalid DSS signature length");
  }
  return session_local._4_4_;
}

Assistant:

static int
hostkey_method_ssh_dss_sig_verify(LIBSSH2_SESSION * session,
                                  const unsigned char *sig,
                                  size_t sig_len,
                                  const unsigned char *m,
                                  size_t m_len, void **abstract)
{
    libssh2_dsa_ctx *dsactx = (libssh2_dsa_ctx *) (*abstract);

    /* Skip past keyname_len(4) + keyname(7){"ssh-dss"} + signature_len(4) */
    sig += 15;
    sig_len -= 15;
    if (sig_len != 40) {
        return _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                              "Invalid DSS signature length");
    }
    return _libssh2_dsa_sha1_verify(dsactx, sig, m, m_len);
}